

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

bool __thiscall
TPZMatrix<Fad<double>_>::SolveEigensystemJacobi
          (TPZMatrix<Fad<double>_> *this,int64_t *numiterations,REAL *tol,
          TPZVec<Fad<double>_> *Eigenvalues,TPZFMatrix<Fad<double>_> *Eigenvectors)

{
  int64_t row;
  bool bVar1;
  int iVar2;
  Fad<double> *pFVar3;
  Fad<double> *this_00;
  int64_t j;
  long lVar4;
  int64_t iVar5;
  long lVar6;
  int64_t i;
  long lVar7;
  bool bVar8;
  double dVar9;
  double local_7e8;
  undefined1 local_7c0 [32];
  long local_7a0;
  Fad<double> exp_1;
  long local_758;
  undefined1 local_750 [16];
  double *local_740;
  double dStack_738;
  undefined1 local_730 [16];
  double *local_720;
  double dStack_718;
  undefined1 local_710 [16];
  double *local_700;
  REAL local_6f8;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> local_6f0;
  Fad<double> exp;
  Fad<double> local_6c0;
  Fad<double> local_6a0;
  Fad<double> answ;
  TPZFNMatrix<9,_Fad<double>_> Matrix_1;
  TPZFNMatrix<3,_Fad<double>_> VecIni_cp;
  TPZFNMatrix<3,_Fad<double>_> VecIni;
  TPZFNMatrix<9,_Fad<double>_> Matrix;
  
  local_700 = (double *)*numiterations;
  local_6f8 = *tol;
  row = (this->super_TPZBaseMatrix).fRow;
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&Matrix,row,row);
  lVar6 = 0;
  lVar7 = 0;
  if (0 < row) {
    lVar7 = row;
  }
  for (; lVar6 != lVar7; lVar6 = lVar6 + 1) {
    for (lVar4 = 0; row != lVar4; lVar4 = lVar4 + 1) {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                (&Matrix_1,this,lVar6,lVar4);
      pFVar3 = TPZFMatrix<Fad<double>_>::operator()
                         (&Matrix.super_TPZFMatrix<Fad<double>_>,lVar6,lVar4);
      Fad<double>::operator=(pFVar3,(Fad<double> *)&Matrix_1);
      Fad<double>::~Fad((Fad<double> *)&Matrix_1);
    }
  }
  bVar1 = SolveEigenvaluesJacobi((TPZMatrix<Fad<double>_> *)&Matrix,numiterations,tol,Eigenvalues);
  if (bVar1) {
    Matrix_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    Matrix_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow.
    _0_4_ = 0;
    Matrix_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol =
         0;
    Matrix_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fDecomposed = '\0';
    Matrix_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fDefPositive = '\0';
    Matrix_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._26_6_
         = 0;
    TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix(&VecIni,row,1,(Fad<double> *)&Matrix_1);
    Fad<double>::~Fad((Fad<double> *)&Matrix_1);
    Matrix_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
    Matrix_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow.
    _0_4_ = 0;
    Matrix_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol =
         0;
    Matrix_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fDecomposed = '\0';
    Matrix_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
    fDefPositive = '\0';
    Matrix_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._26_6_
         = 0;
    TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix(&VecIni_cp,row,1,(Fad<double> *)&Matrix_1);
    Fad<double>::~Fad((Fad<double> *)&Matrix_1);
    (*(Eigenvectors->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xd])(Eigenvectors,row,row);
    (*(Eigenvectors->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(Eigenvectors);
    for (local_7a0 = 0; local_7a0 != lVar7; local_7a0 = local_7a0 + 1) {
      lVar6 = 0;
      iVar5 = row;
      while( true ) {
        bVar8 = iVar5 == 0;
        iVar5 = iVar5 + -1;
        if (bVar8) break;
        iVar2 = rand();
        Matrix_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
        super_TPZSavable._vptr_TPZSavable = (_func_int **)(double)iVar2;
        Matrix_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
        fRow._0_4_ = 0;
        Matrix_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
        fCol = 0;
        Matrix_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
        fDecomposed = '\0';
        Matrix_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
        fDefPositive = '\0';
        Matrix_1.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
        _26_6_ = 0;
        Fad<double>::operator=
                  ((Fad<double> *)
                   ((long)&(VecIni.super_TPZFMatrix<Fad<double>_>.fElem)->val_ + lVar6),
                   (Fad<double> *)&Matrix_1);
        Fad<double>::~Fad((Fad<double> *)&Matrix_1);
        lVar6 = lVar6 + 0x20;
      }
      TPZFMatrix<Fad<double>_>::TPZFMatrix((TPZFMatrix<Fad<double>_> *)&answ,this);
      TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(&Matrix_1,(TPZFMatrix<Fad<double>_> *)&answ);
      TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)&answ);
      lVar6 = local_7a0;
      Fad<double>::Fad(&local_6a0,Eigenvalues->fStore + local_7a0);
      local_6c0.val_ = 1e-05;
      local_6c0.dx_.num_elts = 0;
      local_6c0.dx_.ptr_to_data = (double *)0x0;
      local_6c0.defaultVal = 0.0;
      ReturnNearestValue(&answ,&local_6a0,Eigenvalues,&local_6c0);
      Fad<double>::~Fad(&local_6c0);
      Fad<double>::~Fad(&local_6a0);
      exp_1.dx_._0_8_ = Eigenvalues->fStore + lVar6;
      exp_1.val_ = (double)&answ;
      Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
                (&exp,(FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)&exp_1);
      if (ABS(exp.val_) <= 1e-05) {
        for (lVar4 = 0; row != lVar4; lVar4 = lVar4 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    ((Fad<double> *)local_7c0,this,lVar4,lVar4);
          local_710._0_8_ = Eigenvalues->fStore + lVar6;
          local_730._0_8_ = (Fad<double> *)0x3f847ae147ae147b;
          local_730._8_8_ = local_730._8_8_ & 0xffffffff00000000;
          local_720 = (double *)0x0;
          dStack_718 = 0.0;
          local_710._8_8_ = local_730;
          local_750._8_8_ = local_710;
          local_750._0_8_ = (Fad<double> *)local_7c0;
          Fad<double>::
          Fad<FadBinaryMinus<Fad<double>,FadExpr<FadBinaryMinus<Fad<double>,Fad<double>>>>>
                    (&exp_1,(FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                             *)local_750);
          TPZFMatrix<Fad<double>_>::PutVal
                    (&Matrix_1.super_TPZFMatrix<Fad<double>_>,lVar4,lVar4,&exp_1);
          Fad<double>::~Fad(&exp_1);
          Fad<double>::~Fad((Fad<double> *)local_730);
          Fad<double>::~Fad((Fad<double> *)local_7c0);
        }
      }
      else {
        for (lVar4 = 0; row != lVar4; lVar4 = lVar4 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (local_7c0,this,lVar4,lVar4);
          local_750._0_8_ = ABS(exp.val_) * 0.01;
          local_750._8_8_ = local_750._8_8_ & 0xffffffff00000000;
          local_6f0.fadexpr_.left_ = Eigenvalues->fStore + lVar6;
          local_740 = (double *)0x0;
          dStack_738 = 0.0;
          local_6f0.fadexpr_.right_ = (Fad<double> *)local_750;
          Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
                    ((Fad<double> *)local_730,&local_6f0);
          local_710._0_8_ = local_7c0;
          local_710._8_8_ = (Fad<double> *)local_730;
          Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
                    (&exp_1,(FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)local_710);
          TPZFMatrix<Fad<double>_>::PutVal
                    (&Matrix_1.super_TPZFMatrix<Fad<double>_>,lVar4,lVar4,&exp_1);
          Fad<double>::~Fad(&exp_1);
          Fad<double>::~Fad((Fad<double> *)local_730);
          Fad<double>::~Fad((Fad<double> *)local_750);
          Fad<double>::~Fad((Fad<double> *)local_7c0);
        }
      }
      local_7e8 = 0.0;
      for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 1) {
        pFVar3 = TPZFMatrix<Fad<double>_>::operator()
                           (&VecIni.super_TPZFMatrix<Fad<double>_>,lVar6,0);
        dVar9 = pFVar3->val_;
        pFVar3 = TPZFMatrix<Fad<double>_>::operator()
                           (&VecIni.super_TPZFMatrix<Fad<double>_>,lVar6,0);
        local_7e8 = local_7e8 + ABS(pFVar3->val_) * ABS(dVar9);
      }
      if (local_7e8 < 0.0) {
        local_7e8 = sqrt(local_7e8);
      }
      else {
        local_7e8 = SQRT(local_7e8);
      }
      for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 1) {
        local_7c0._0_8_ =
             TPZFMatrix<Fad<double>_>::operator()(&VecIni.super_TPZFMatrix<Fad<double>_>,lVar6,0);
        exp_1.dx_._0_8_ = exp_1.dx_._0_8_ & 0xffffffff00000000;
        exp_1.dx_.ptr_to_data = (double *)0x0;
        exp_1.defaultVal = 0.0;
        local_7c0._8_8_ = &exp_1;
        exp_1.val_ = local_7e8;
        pFVar3 = TPZFMatrix<Fad<double>_>::operator()
                           (&VecIni.super_TPZFMatrix<Fad<double>_>,lVar6,0);
        Fad<double>::operator=
                  (pFVar3,(FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)local_7c0);
        Fad<double>::~Fad(&exp_1);
      }
      local_7e8 = 10.0;
      for (local_758 = 0; (local_6f8 < local_7e8 && (local_758 <= (long)local_700));
          local_758 = local_758 + 1) {
        for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 1) {
          pFVar3 = TPZFMatrix<Fad<double>_>::operator()
                             (&VecIni.super_TPZFMatrix<Fad<double>_>,lVar6,0);
          this_00 = TPZFMatrix<Fad<double>_>::operator()
                              (&VecIni_cp.super_TPZFMatrix<Fad<double>_>,lVar6,0);
          Fad<double>::operator=(this_00,pFVar3);
        }
        Solve_LU((TPZMatrix<Fad<double>_> *)&Matrix_1,&VecIni.super_TPZFMatrix<Fad<double>_>);
        local_7e8 = 0.0;
        for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 1) {
          pFVar3 = TPZFMatrix<Fad<double>_>::operator()
                             (&VecIni.super_TPZFMatrix<Fad<double>_>,lVar6,0);
          dVar9 = pFVar3->val_;
          pFVar3 = TPZFMatrix<Fad<double>_>::operator()
                             (&VecIni.super_TPZFMatrix<Fad<double>_>,lVar6,0);
          local_7e8 = local_7e8 + ABS(pFVar3->val_) * ABS(dVar9);
        }
        if (local_7e8 < 0.0) {
          dVar9 = sqrt(local_7e8);
        }
        else {
          dVar9 = SQRT(local_7e8);
        }
        local_7e8 = 0.0;
        for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 1) {
          local_7c0._0_8_ =
               TPZFMatrix<Fad<double>_>::operator()(&VecIni.super_TPZFMatrix<Fad<double>_>,lVar6,0);
          exp_1.dx_._0_8_ = exp_1.dx_._0_8_ & 0xffffffff00000000;
          exp_1.dx_.ptr_to_data = (double *)0x0;
          exp_1.defaultVal = 0.0;
          local_7c0._8_8_ = &exp_1;
          exp_1.val_ = dVar9;
          pFVar3 = TPZFMatrix<Fad<double>_>::operator()
                             (&VecIni.super_TPZFMatrix<Fad<double>_>,lVar6,0);
          Fad<double>::operator=
                    (pFVar3,(FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)local_7c0);
          Fad<double>::~Fad(&exp_1);
          pFVar3 = TPZFMatrix<Fad<double>_>::operator()
                             (&VecIni_cp.super_TPZFMatrix<Fad<double>_>,lVar6,0);
          local_730._8_8_ =
               TPZFMatrix<Fad<double>_>::operator()(&VecIni.super_TPZFMatrix<Fad<double>_>,lVar6,0);
          local_730._0_8_ = pFVar3;
          pFVar3 = TPZFMatrix<Fad<double>_>::operator()
                             (&VecIni_cp.super_TPZFMatrix<Fad<double>_>,lVar6,0);
          local_750._8_8_ =
               TPZFMatrix<Fad<double>_>::operator()(&VecIni.super_TPZFMatrix<Fad<double>_>,lVar6,0);
          local_7c0._0_8_ = local_730;
          local_7c0._8_8_ = local_750;
          local_750._0_8_ = pFVar3;
          Fad<double>::
          Fad<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMinus<Fad<double>,Fad<double>>>>>
                    (&exp_1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                             *)local_7c0);
          local_7e8 = local_7e8 + ABS(exp_1.val_);
          Fad<double>::~Fad(&exp_1);
        }
        if (local_7e8 < 0.0) {
          local_7e8 = sqrt(local_7e8);
        }
        else {
          local_7e8 = SQRT(local_7e8);
        }
      }
      for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 1) {
        pFVar3 = TPZFMatrix<Fad<double>_>::operator()
                           (&VecIni.super_TPZFMatrix<Fad<double>_>,lVar6,0);
        Fad<double>::Fad(&exp_1,pFVar3);
        if (ABS(exp_1.val_) < 1e-05) {
          local_7c0._0_8_ = (Fad<double> *)0x0;
          Fad<double>::operator=<double,_nullptr>(&exp_1,(double *)local_7c0);
        }
        pFVar3 = TPZFMatrix<Fad<double>_>::operator()(Eigenvectors,local_7a0,lVar6);
        Fad<double>::operator=(pFVar3,&exp_1);
        Fad<double>::~Fad(&exp_1);
      }
      Fad<double>::~Fad(&exp);
      Fad<double>::~Fad(&answ);
      TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&Matrix_1);
    }
    TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix(&VecIni_cp);
    TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix(&VecIni);
  }
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix(&Matrix);
  return bVar1;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}